

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

void __thiscall QCommandLinkButton::QCommandLinkButton(QCommandLinkButton *this,QWidget *parent)

{
  EVP_PKEY_CTX *ctx;
  QCommandLinkButtonPrivate *this_00;
  QPushButton *in_RSI;
  QCommandLinkButtonPrivate *in_RDI;
  QCommandLinkButtonPrivate *d;
  QPushButtonPrivate *in_stack_ffffffffffffffe8;
  
  ctx = (EVP_PKEY_CTX *)operator_new(0x2f8);
  QCommandLinkButtonPrivate::QCommandLinkButtonPrivate(in_RDI);
  QPushButton::QPushButton(in_RSI,in_stack_ffffffffffffffe8,(QWidget *)in_RDI);
  *(undefined ***)
   &(in_RDI->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate =
       &PTR_metaObject_00d11860;
  *(undefined ***)
   &(in_RDI->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x10
       = &PTR__QCommandLinkButton_00d11a30;
  this_00 = d_func((QCommandLinkButton *)0x555f7e);
  QCommandLinkButtonPrivate::init(this_00,ctx);
  return;
}

Assistant:

QCommandLinkButton::QCommandLinkButton(QWidget *parent)
: QPushButton(*new QCommandLinkButtonPrivate, parent)
{
    Q_D(QCommandLinkButton);
    d->init();
}